

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O1

void __thiscall
checkqueue_tests::test_CheckQueueControl_Locks::test_method(test_CheckQueueControl_Locks *this)

{
  long lVar1;
  bool bVar2;
  pointer ptVar3;
  int iVar4;
  __uniq_ptr_data<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>,_true,_true>
  this_00;
  pointer ptVar5;
  ulong uVar6;
  thread *ptVar7;
  undefined8 uVar8;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_00;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_01;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_02;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_03;
  anon_class_24_3_8803dd74_for__M_head_impl *__args;
  anon_class_56_7_0ebc48f7_for__M_head_impl *__args_00;
  anon_class_56_7_0ebc48f7_for__M_head_impl *extraout_RDX_04;
  anon_class_56_7_0ebc48f7_for__M_head_impl *__args_01;
  thread *thread_1;
  condition_variable *this_01;
  ulong uVar9;
  long lVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  pointer ptVar13;
  pointer ptVar14;
  ulong uVar15;
  uint uVar16;
  thread *thread;
  thread *ptVar17;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar18;
  char *local_1a0;
  char *local_198;
  atomic<int> *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 local_160 [16];
  pointer local_150;
  condition_variable *local_148;
  atomic<int> *local_140;
  atomic<int> *local_138;
  bool *local_130;
  mutex m;
  bool done_ack;
  undefined3 uStack_f3;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  atomic<int> fails;
  atomic<int> nThreads;
  vector<std::thread,_std::allocator<std::thread>_> tg;
  __single_object queue;
  bool has_lock;
  vector<std::thread,_std::allocator<std::thread>_> tg_1;
  unique_lock<std::mutex> l;
  condition_variable cv;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.
  super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>._M_t.
  super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>.
  super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>)
       operator_new(0x100);
  CCheckQueue<FakeCheck>::CCheckQueue
            ((CCheckQueue<FakeCheck> *)
             this_00.
             super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>
             .super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl,0x80,3);
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_01 = (condition_variable *)0x0;
  nThreads.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  fails.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  lVar10 = 0;
  __args = extraout_RDX;
  queue._M_t.
  super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>._M_t.
  super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>.
  super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl =
       (__uniq_ptr_data<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>,_true,_true>
        )(__uniq_ptr_data<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>
           .super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl;
  do {
    ptVar14 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ptVar13 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_160._0_8_ = &queue;
    local_160._8_8_ = &nThreads;
    local_150 = (pointer)&fails;
    if (tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00319258;
        std::__throw_length_error("vector::_M_realloc_insert");
        goto LAB_00319098;
      }
      uVar15 = (long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar6 = uVar15 + (uVar15 == 0);
      uVar9 = uVar6 + uVar15;
      if (0xffffffffffffffe < uVar9) {
        uVar9 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar6,uVar15)) {
        uVar9 = 0xfffffffffffffff;
      }
      if (uVar9 == 0) {
        ptVar7 = (thread *)0x0;
      }
      else {
        ptVar7 = __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&tg,uVar9,(void *)0x0);
        __args = extraout_RDX_01;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__0>
                ((allocator_type *)(ptVar7 + uVar15),(thread *)local_160,__args);
      ptVar17 = ptVar7;
      for (ptVar5 = ptVar13; ptVar5 != ptVar14; ptVar5 = ptVar5 + 1) {
        (ptVar17->_M_id)._M_thread = 0;
        (ptVar17->_M_id)._M_thread = (ptVar5->_M_id)._M_thread;
        (ptVar5->_M_id)._M_thread = 0;
        ptVar17 = ptVar17 + 1;
      }
      __args = extraout_RDX_02;
      if (ptVar13 != (pointer)0x0) {
        operator_delete(ptVar13,(long)tg.
                                      super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ptVar13);
        __args = extraout_RDX_03;
      }
      tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar7 + uVar9;
      tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar7;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__0>
                ((allocator_type *)
                 tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)local_160,__args);
      __args = extraout_RDX_00;
      ptVar17 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
    ._M_finish = ptVar17 + 1;
    ptVar13 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar10 = lVar10 + 1;
    ptVar14 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
  } while (lVar10 != 3);
  for (; ptVar14 != ptVar13; ptVar14 = ptVar14 + 1) {
    if ((ptVar14->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17a;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  m.super___mutex_base._M_mutex._8_8_ = m.super___mutex_base._M_mutex._8_8_ & 0xffffffffffffff00;
  m.super___mutex_base._M_mutex.__align = (long)&PTR__lazy_ostream_013abb30;
  m.super___mutex_base._M_mutex._16_8_ = boost::unit_test::lazy_ostream::inst;
  m.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0xf6cf21;
  _done_ack = 0;
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)CONCAT71(tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                fails.super___atomic_base<int>._M_i == 0);
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  l._M_device = (mutex_type *)anon_var_dwarf_5ff55e;
  l._8_8_ = (long)
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
            + 0x69;
  local_148 = (condition_variable *)&local_190;
  local_190 = &fails;
  local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
  local_160._0_8_ = &PTR__lazy_ostream_013ad060;
  local_150 = (pointer)boost::unit_test::lazy_ostream::inst;
  ptVar13 = (pointer)&has_lock;
  _cv = &PTR__lazy_ostream_013abcf0;
  pvVar11 = (iterator)0x2;
  pvVar12 = (iterator)0x2;
  _has_lock = (id)(id)&done_ack;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tg_1,(lazy_ostream *)&m,2,2,REQUIRE,0xe6bd3a,(size_t)&l,0x17a,
             local_160,"0",&cv);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&tg);
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  m.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  m.super___mutex_base._M_mutex._16_8_ = 0;
  m.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  m.super___mutex_base._M_mutex.__align = 0;
  m.super___mutex_base._M_mutex._8_8_ = 0;
  this_01 = &cv;
  std::condition_variable::condition_variable(this_01);
  _has_lock = (id)((ulong)_has_lock & 0xffffffffffffff00);
  nThreads.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((uint)nThreads.super___atomic_base<int>._M_i & 0xffffff00);
  fails.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((uint)fails.super___atomic_base<int>._M_i & 0xffffff00);
  _done_ack = _done_ack & 0xffffff00;
  l._8_8_ = l._8_8_ & 0xffffffffffffff00;
  l._M_device = (mutex_type *)&m;
  std::unique_lock<std::mutex>::lock(&l);
  ptVar3 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar5 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  l._M_owns = true;
  local_160._0_8_ = &queue;
  local_140 = &nThreads;
  local_138 = &fails;
  local_160._8_8_ = (lazy_ostream *)&m;
  local_150 = ptVar13;
  local_148 = this_01;
  local_130 = &done_ack;
  if (tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ptVar14 = (pointer)((long)tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (ptVar14 == (pointer)0x7ffffffffffffff8) {
LAB_00319098:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        uVar8 = std::__throw_length_error("vector::_M_realloc_insert");
        __cxa_begin_catch(uVar8);
        if (ptVar13 == (pointer)0x0) {
          if ((ptVar14->_M_id)._M_thread != 0) {
            std::terminate();
          }
        }
        else {
          operator_delete(ptVar13,(long)this_01 << 3);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          uVar8 = __cxa_rethrow();
          __cxa_end_catch();
          std::unique_lock<std::mutex>::~unique_lock(&l);
          std::condition_variable::~condition_variable(&cv);
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&tg_1);
          std::unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>::
          ~unique_ptr(&queue);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            _Unwind_Resume(uVar8);
          }
        }
      }
      goto LAB_00319258;
    }
    uVar15 = (long)ptVar14 >> 3;
    uVar6 = uVar15 + (uVar15 == 0);
    uVar9 = uVar6 + uVar15;
    if (0xffffffffffffffe < uVar9) {
      uVar9 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar6,uVar15)) {
      uVar9 = 0xfffffffffffffff;
    }
    if (uVar9 == 0) {
      ptVar7 = (thread *)0x0;
      __args_01 = __args_00;
    }
    else {
      ptVar7 = __gnu_cxx::new_allocator<std::thread>::allocate
                         ((new_allocator<std::thread> *)&tg_1,uVar9,(void *)0x0);
      __args_01 = extraout_RDX_04;
    }
    std::allocator_traits<std::allocator<std::thread>>::
    construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__1>
              ((allocator_type *)(ptVar7 + uVar15),(thread *)local_160,__args_01);
    ptVar17 = ptVar7;
    for (ptVar13 = ptVar5; ptVar13 != ptVar3; ptVar13 = ptVar13 + 1) {
      (ptVar17->_M_id)._M_thread = 0;
      (ptVar17->_M_id)._M_thread = (ptVar13->_M_id)._M_thread;
      (ptVar13->_M_id)._M_thread = 0;
      ptVar17 = ptVar17 + 1;
    }
    if (ptVar5 != (pointer)0x0) {
      operator_delete(ptVar5,(long)tg_1.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar5)
      ;
    }
    tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ptVar7 + uVar9;
    tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = ptVar7;
  }
  else {
    std::allocator_traits<std::allocator<std::thread>>::
    construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__1>
              ((allocator_type *)
               tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,(thread *)local_160,__args_00);
    ptVar17 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_finish = ptVar17 + 1;
  if (has_lock == false) {
    do {
      std::condition_variable::wait((unique_lock *)&cv);
    } while (has_lock == false);
  }
  uVar16 = 0;
  do {
    iVar4 = pthread_mutex_trylock
                      ((pthread_mutex_t *)
                       ((long)queue._M_t.
                              super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>
                              .super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl +
                       0xd8));
    if (iVar4 == 0) break;
    bVar2 = uVar16 < 99;
    uVar16 = uVar16 + 1;
  } while (bVar2);
  nThreads.super___atomic_base<int>._M_i._0_1_ = 1;
  std::condition_variable::notify_one();
  if ((char)fails.super___atomic_base<int>._M_i == '\0') {
    do {
      std::condition_variable::wait((unique_lock *)&cv);
    } while ((char)fails.super___atomic_base<int>._M_i == '\0');
  }
  _done_ack = CONCAT31(uStack_f3,1);
  std::condition_variable::notify_one();
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar18 = 0x318f66;
  file_00.m_end = (iterator)0x19e;
  file_00.m_begin = (iterator)&local_170;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_180,
             msg_00);
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,iVar4 != 0);
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_190 = (atomic<int> *)0xe6bd39;
  local_188 = "";
  local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
  local_160._0_8_ = &PTR__lazy_ostream_013abc70;
  local_150 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_148 = (condition_variable *)&local_190;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_198 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tg,(lazy_ostream *)local_160,2,0,WARN,_cVar18,(size_t)&local_1a0,
             0x19e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::unique_lock<std::mutex>::~unique_lock(&l);
  ptVar13 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ptVar14 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; ptVar14 != ptVar13; ptVar14 = ptVar14 + 1) {
    if ((ptVar14->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::condition_variable::~condition_variable(&cv);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&tg_1);
  std::unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>::
  ~unique_ptr(&queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00319258:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueueControl_Locks)
{
    auto queue = std::make_unique<Standard_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    {
        std::vector<std::thread> tg;
        std::atomic<int> nThreads {0};
        std::atomic<int> fails {0};
        for (size_t i = 0; i < 3; ++i) {
            tg.emplace_back(
                    [&]{
                    CCheckQueueControl<FakeCheck> control(queue.get());
                    // While sleeping, no other thread should execute to this point
                    auto observed = ++nThreads;
                    UninterruptibleSleep(std::chrono::milliseconds{10});
                    fails += observed  != nThreads;
                    });
        }
        for (auto& thread: tg) {
            if (thread.joinable()) thread.join();
        }
        BOOST_REQUIRE_EQUAL(fails, 0);
    }
    {
        std::vector<std::thread> tg;
        std::mutex m;
        std::condition_variable cv;
        bool has_lock{false};
        bool has_tried{false};
        bool done{false};
        bool done_ack{false};
        {
            std::unique_lock<std::mutex> l(m);
            tg.emplace_back([&]{
                    CCheckQueueControl<FakeCheck> control(queue.get());
                    std::unique_lock<std::mutex> ll(m);
                    has_lock = true;
                    cv.notify_one();
                    cv.wait(ll, [&]{return has_tried;});
                    done = true;
                    cv.notify_one();
                    // Wait until the done is acknowledged
                    //
                    cv.wait(ll, [&]{return done_ack;});
                    });
            // Wait for thread to get the lock
            cv.wait(l, [&](){return has_lock;});
            bool fails = false;
            for (auto x = 0; x < 100 && !fails; ++x) {
                fails = queue->m_control_mutex.try_lock();
            }
            has_tried = true;
            cv.notify_one();
            cv.wait(l, [&](){return done;});
            // Acknowledge the done
            done_ack = true;
            cv.notify_one();
            BOOST_REQUIRE(!fails);
        }
        for (auto& thread: tg) {
            if (thread.joinable()) thread.join();
        }
    }
}